

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O3

Client __thiscall capnp::EzRpcClient::importCap(EzRpcClient *this,StringPtr name)

{
  _func_int **pp_Var1;
  PromiseNode *pPVar2;
  char *pcVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  TransformPromiseNodeBase *pTVar6;
  long in_RCX;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *extraout_RDX_02;
  ForkBranchBase *pFVar8;
  Client CVar9;
  Own<capnp::ClientHook> OVar10;
  StringPtr name_00;
  PropagateException local_b9;
  undefined1 local_b8 [8];
  PromiseNode *local_b0;
  Promise<kj::Own<capnp::ClientHook>_> local_a8;
  Event *local_98;
  TransformPromiseNodeBase *local_90;
  String local_88;
  ForkBranchBase *local_68;
  Disposer *local_60;
  Disposer *pDStack_58;
  undefined1 local_50 [32];
  ClientHook *pCVar7;
  
  name_00.content.size_ = (char *)name.content.size_;
  pFVar8 = (ForkBranchBase *)name.content.ptr;
  pp_Var1 = (pFVar8->onReadyEvent).event[1]._vptr_Event;
  if (pp_Var1 == (_func_int **)0x0) {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_b8);
    kj::heapString(&local_88,name_00.content.size_,in_RCX - 1);
    pAVar5 = local_88.content.disposer;
    sVar4 = local_88.content.size_;
    pcVar3 = local_88.content.ptr;
    local_60 = (Disposer *)local_88.content.ptr;
    pDStack_58 = (Disposer *)local_88.content.size_;
    local_50._0_8_ = local_88.content.disposer;
    local_88.content.ptr = (char *)0x0;
    local_88.content.size_ = 0;
    local_68 = pFVar8;
    pTVar6 = (TransformPromiseNodeBase *)operator_new(0x48);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar6,(Own<kj::_::PromiseNode> *)local_b8,
               kj::
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc.c++:181:9),_kj::String>
               ::operator()<>);
    (pTVar6->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00623ec8;
    pTVar6[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pFVar8;
    pTVar6[1].dependency.disposer = (Disposer *)pcVar3;
    pTVar6[1].dependency.ptr = (PromiseNode *)sVar4;
    pTVar6[1].continuationTracePtr = pAVar5;
    local_60 = (Disposer *)0x0;
    pDStack_58 = (Disposer *)0x0;
    local_98 = (Event *)&kj::_::
                         HeapDisposer<kj::_::TransformPromiseNode<capnp::Capability::Client,kj::_::Void,kj::CaptureByMove<capnp::EzRpcClient::importCap(kj::StringPtr)::$_0,kj::String>,kj::_::PropagateException>>
                         ::instance;
    local_90 = pTVar6;
    kj::
    heap<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,capnp::Capability::Client,capnp::Capability::Client::Client<capnp::Capability::Client,void>(kj::Promise<capnp::Capability::Client>&&)::_lambda(capnp::Capability::Client&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::Capability::Client::Client<capnp::Capability::Client,void>(kj::Promise<capnp::Capability::Client>&&)::_lambda(capnp::Capability::Client&&)_1_,kj::_::PropagateException>
              ((Own<kj::_::PromiseNode> *)(local_50 + 8),
               (anon_class_1_0_00000001_for_func *)&local_98,&local_b9);
    local_a8.super_PromiseBase.node.disposer = (Disposer *)local_50._8_8_;
    local_a8.super_PromiseBase.node.ptr = (PromiseNode *)local_50._16_8_;
    OVar10 = newLocalPromiseClient((capnp *)this,&local_a8);
    pPVar2 = local_a8.super_PromiseBase.node.ptr;
    pCVar7 = OVar10.ptr;
    if ((EventLoop *)local_a8.super_PromiseBase.node.ptr != (EventLoop *)0x0) {
      local_a8.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_a8.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_a8.super_PromiseBase.node.disposer,
                 (long)&pPVar2->_vptr_PromiseNode +
                 (long)((EventPort *)pPVar2->_vptr_PromiseNode)[-2]._vptr_EventPort);
      pCVar7 = extraout_RDX;
    }
    pTVar6 = local_90;
    if (local_90 != (TransformPromiseNodeBase *)0x0) {
      local_90 = (TransformPromiseNodeBase *)0x0;
      (**local_98->_vptr_Event)
                (local_98,(pTVar6->super_PromiseNode)._vptr_PromiseNode[-2] +
                          (long)&(pTVar6->super_PromiseNode)._vptr_PromiseNode);
      pCVar7 = extraout_RDX_00;
    }
    sVar4 = local_88.content.size_;
    pcVar3 = local_88.content.ptr;
    if (local_88.content.ptr != (char *)0x0) {
      local_88.content.ptr = (char *)0x0;
      local_88.content.size_ = 0;
      (**(local_88.content.disposer)->_vptr_ArrayDisposer)
                (local_88.content.disposer,pcVar3,1,sVar4,sVar4,0);
      pCVar7 = extraout_RDX_01;
    }
    pPVar2 = local_b0;
    if (local_b0 != (PromiseNode *)0x0) {
      local_b0 = (PromiseNode *)0x0;
      (**(code **)*(_func_int **)local_b8)
                (local_b8,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
      pCVar7 = extraout_RDX_02;
    }
  }
  else {
    name_00.content.ptr = (char *)pp_Var1;
    CVar9 = Impl::ClientContext::restore((ClientContext *)this,name_00);
    pCVar7 = CVar9.hook.ptr;
  }
  CVar9.hook.ptr = pCVar7;
  CVar9.hook.disposer = (Disposer *)this;
  return (Client)CVar9.hook;
}

Assistant:

Capability::Client EzRpcClient::importCap(kj::StringPtr name) {
  KJ_IF_MAYBE(client, impl->clientContext) {
    return client->get()->restore(name);
  } else {
    return impl->setupPromise.addBranch().then(kj::mvCapture(kj::heapString(name),
        [this](kj::String&& name) {
      return KJ_ASSERT_NONNULL(impl->clientContext)->restore(name);
    }));
  }
}